

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderNext(PmaReader *pReadr)

{
  IncrMerger *pIncr_00;
  bool bVar1;
  int bEof;
  IncrMerger *pIncr;
  u64 nRec;
  PmaReader *pPStack_18;
  int rc;
  PmaReader *pReadr_local;
  
  nRec._4_4_ = 0;
  pIncr = (IncrMerger *)0x0;
  pPStack_18 = pReadr;
  if (pReadr->iEof <= pReadr->iReadOff) {
    pIncr_00 = pReadr->pIncr;
    bVar1 = true;
    if (((pIncr_00 != (IncrMerger *)0x0) && (nRec._4_4_ = vdbeIncrSwap(pIncr_00), nRec._4_4_ == 0))
       && (pIncr_00->bEof == 0)) {
      nRec._4_4_ = vdbePmaReaderSeek(pIncr_00->pTask,pPStack_18,pIncr_00->aFile,pIncr_00->iStartOff)
      ;
      bVar1 = false;
    }
    if (bVar1) {
      vdbePmaReaderClear(pPStack_18);
      return nRec._4_4_;
    }
  }
  if (nRec._4_4_ == 0) {
    nRec._4_4_ = vdbePmaReadVarint(pPStack_18,(u64 *)&pIncr);
  }
  if (nRec._4_4_ == 0) {
    pPStack_18->nKey = (int)pIncr;
    nRec._4_4_ = vdbePmaReadBlob(pPStack_18,(int)pIncr,&pPStack_18->aKey);
  }
  return nRec._4_4_;
}

Assistant:

static int vdbePmaReaderNext(PmaReader *pReadr){
  int rc = SQLITE_OK;             /* Return Code */
  u64 nRec = 0;                   /* Size of record in bytes */


  if( pReadr->iReadOff>=pReadr->iEof ){
    IncrMerger *pIncr = pReadr->pIncr;
    int bEof = 1;
    if( pIncr ){
      rc = vdbeIncrSwap(pIncr);
      if( rc==SQLITE_OK && pIncr->bEof==0 ){
        rc = vdbePmaReaderSeek(
            pIncr->pTask, pReadr, &pIncr->aFile[0], pIncr->iStartOff
        );
        bEof = 0;
      }
    }

    if( bEof ){
      /* This is an EOF condition */
      vdbePmaReaderClear(pReadr);
      testcase( rc!=SQLITE_OK );
      return rc;
    }
  }

  if( rc==SQLITE_OK ){
    rc = vdbePmaReadVarint(pReadr, &nRec);
  }
  if( rc==SQLITE_OK ){
    pReadr->nKey = (int)nRec;
    rc = vdbePmaReadBlob(pReadr, (int)nRec, &pReadr->aKey);
    testcase( rc!=SQLITE_OK );
  }

  return rc;
}